

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O0

void __thiscall
FrobTadsApplicationCurses::clear
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  uint in_R9D;
  int x;
  int y;
  chtype c;
  int x_00;
  
  uVar1 = in_R9D | 0x20;
  for (; x_00 = in_EDX, in_ESI <= in_ECX; in_ESI = in_ESI + 1) {
    for (; x_00 <= in_R8D; x_00 = x_00 + 1) {
      std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
                ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bb59);
      FrobTadsWindow::printChar
                ((FrobTadsWindow *)CONCAT44(in_R9D,uVar1),in_ESI,x_00,
                 (chtype)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

void
FrobTadsApplicationCurses::clear( int top, int left, int bottom, int right, int attrs )
{
    const chtype c = attrs | ' ';
    for (int y = top; y <= bottom; ++y) {
        for (int x = left; x <= right; ++x) {
            this->fGameWindow->printChar(y, x, c);
        }
    }
}